

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::decodeOpcode(MipsParser *this,string *name,tMipsOpcode *opcode)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  MipsParser *this_00;
  size_t pos;
  size_t local_38;
  
  pcVar4 = opcode->name;
  local_38 = 0;
  MipsRegisterData::reset(&this->registers);
  this_00 = (MipsParser *)&this->immediate;
  MipsImmediateData::reset((MipsImmediateData *)this_00);
  (this->opcodeData).vfpuSize = -1;
  (this->opcodeData).vectorCondition = -1;
  this->hasFixedSecondaryImmediate = false;
  do {
    while( true ) {
      while( true ) {
        cVar2 = *pcVar4;
        if (cVar2 == '\0') {
          return name->_M_string_length <= local_38;
        }
        pcVar4 = pcVar4 + 1;
        if (cVar2 != 'B') break;
        bVar3 = decodeCop2BranchCondition
                          (this_00,name,&local_38,&(this->immediate).secondary.originalValue);
        if (!bVar3) {
          return false;
        }
        (this->immediate).secondary.type = Cop2BranchType;
        (this->immediate).secondary.value = (this->immediate).secondary.originalValue;
        this->hasFixedSecondaryImmediate = true;
      }
      if (cVar2 != 'S') break;
      bVar3 = decodeVfpuType(this_00,name,&local_38,&(this->opcodeData).vfpuSize);
      if (!bVar3) {
        return false;
      }
    }
    if (name->_M_string_length <= local_38) {
      return false;
    }
    pcVar1 = (name->_M_dataplus)._M_p + local_38;
    local_38 = local_38 + 1;
  } while (cVar2 == *pcVar1);
  return false;
}

Assistant:

bool MipsParser::decodeOpcode(const std::string& name, const tMipsOpcode& opcode)
{
	const char* encoding = opcode.name;
	size_t pos = 0;

	registers.reset();
	immediate.reset();
	opcodeData.reset();
	hasFixedSecondaryImmediate = false;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'S':
			CHECK(decodeVfpuType(name,pos,opcodeData.vfpuSize));
			break;
		case 'B':
			CHECK(decodeCop2BranchCondition(name,pos,immediate.secondary.originalValue));
			immediate.secondary.type = MipsImmediateType::Cop2BranchType;
			immediate.secondary.value = immediate.secondary.originalValue;
			hasFixedSecondaryImmediate = true;
			break;
		default:
			CHECK(pos < name.size());
			CHECK(*(encoding-1) == name[pos++]);
			break;
		}
	}

	return pos >= name.size();
}